

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromBasePattern
          (PatternMap *this,UnicodeString *basePattern,UBool *skeletonWasSpecified)

{
  short sVar1;
  ushort uVar2;
  byte bVar3;
  char16_t *pcVar4;
  char16_t cVar5;
  int iVar6;
  int32_t length;
  int srcStart;
  int srcLength;
  PtnElem *pPVar7;
  
  sVar1 = (basePattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (basePattern->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (iVar6 == 0) {
    cVar5 = L'\xffff';
  }
  else {
    if (((int)sVar1 & 2U) == 0) {
      pcVar4 = (basePattern->fUnion).fFields.fArray;
    }
    else {
      pcVar4 = (basePattern->fUnion).fStackFields.fBuffer;
    }
    cVar5 = *pcVar4;
  }
  iVar6 = -0x47;
  if ((ushort)(cVar5 + L'﾿') < 0x1a) {
    iVar6 = -0x41;
  }
  else if (0x19 < (ushort)(cVar5 + L'ﾟ')) {
    pPVar7 = (PtnElem *)0x0;
    goto LAB_002ec62e;
  }
  pPVar7 = this->boot[iVar6 + (uint)(ushort)cVar5];
LAB_002ec62e:
  while( true ) {
    if (pPVar7 == (PtnElem *)0x0) {
      return (UnicodeString *)0x0;
    }
    sVar1 = (basePattern->fUnion).fStackFields.fLengthAndFlags;
    uVar2 = (pPVar7->basePattern).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar2 & 1) == 0) {
      if ((short)uVar2 < 0) {
        iVar6 = (pPVar7->basePattern).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)(short)uVar2 >> 5;
      }
      srcStart = 0;
      if (iVar6 < 0) {
        srcStart = iVar6;
      }
      srcLength = iVar6 - srcStart;
      if (iVar6 <= iVar6 - srcStart) {
        srcLength = iVar6;
      }
      if (iVar6 < 0) {
        srcLength = 0;
      }
      if (sVar1 < 0) {
        length = (basePattern->fUnion).fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      if ((uVar2 & 2) == 0) {
        pcVar4 = (pPVar7->basePattern).fUnion.fFields.fArray;
      }
      else {
        pcVar4 = (pPVar7->basePattern).fUnion.fStackFields.fBuffer;
      }
      bVar3 = icu_63::UnicodeString::doCompare(basePattern,0,length,pcVar4,srcStart,srcLength);
    }
    else {
      bVar3 = ~(byte)sVar1 & 1;
    }
    if (bVar3 == 0) break;
    pPVar7 = (pPVar7->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
  }
  *skeletonWasSpecified = pPVar7->skeletonWasSpecified;
  return &pPVar7->pattern;
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromBasePattern(const UnicodeString& basePattern, UBool& skeletonWasSpecified) const { // key to search for
   PtnElem *curElem;

   if ((curElem=getHeader(basePattern.charAt(0)))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       if ( basePattern.compare(curElem->basePattern)==0 ) {
          skeletonWasSpecified = curElem->skeletonWasSpecified;
          return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}